

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeAddedConstants.cpp
# Opt level: O0

void __thiscall wasm::OptimizeAddedConstants::findPropagatable(OptimizeAddedConstants *this)

{
  bool bVar1;
  bool bVar2;
  Function *pFVar3;
  pointer pLVar4;
  Locations *this_00;
  Binary *pBVar5;
  SetInfluences *this_01;
  reference ppLVar6;
  Expression *this_02;
  Expression *parent;
  LocalGet *get;
  const_iterator __end7;
  const_iterator __begin7;
  SetInfluences *__range7;
  bool canPropagate;
  Binary *add;
  LocalSet *set;
  type *_;
  type *location;
  _Self local_1b8;
  const_iterator __end2;
  const_iterator __begin2;
  Locations *__range2;
  GetParents parents;
  OptimizeAddedConstants *this_local;
  
  parents.inner.parentMap._M_h._M_single_bucket = (__node_base_ptr)this;
  pFVar3 = Walker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>
           ::getFunction(&(this->
                          super_WalkerPass<wasm::PostWalker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>_>
                          ).
                          super_PostWalker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>
                          .
                          super_Walker<wasm::OptimizeAddedConstants,_wasm::UnifiedExpressionVisitor<wasm::OptimizeAddedConstants,_void>_>
                        );
  anon_unknown_177::GetParents::GetParents((GetParents *)&__range2,pFVar3->body);
  pLVar4 = std::unique_ptr<wasm::LazyLocalGraph,_std::default_delete<wasm::LazyLocalGraph>_>::
           operator->(&this->localGraph);
  this_00 = LazyLocalGraph::getLocations(pLVar4);
  __end2 = std::
           map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
           ::begin(this_00);
  local_1b8._M_node =
       (_Base_ptr)
       std::
       map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
       ::end(this_00);
  do {
    bVar1 = std::operator!=(&__end2,&local_1b8);
    if (!bVar1) {
      anon_unknown_177::GetParents::~GetParents((GetParents *)&__range2);
      return;
    }
    location = &std::
                _Rb_tree_const_iterator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>::
                operator*(&__end2)->first;
    _ = (type *)std::get<0ul,wasm::Expression*const,wasm::Expression**>
                          ((pair<wasm::Expression_*const,_wasm::Expression_**> *)location);
    set = (LocalSet *)
          std::get<1ul,wasm::Expression*const,wasm::Expression**>
                    ((pair<wasm::Expression_*const,_wasm::Expression_**> *)location);
    add = (Binary *)Expression::dynCast<wasm::LocalSet>((Expression *)*_);
    if ((((add != (Binary *)0x0) &&
         (pBVar5 = Expression::dynCast<wasm::Binary>(add->left), pBVar5 != (Binary *)0x0)) &&
        (pBVar5->op == AddInt32)) &&
       ((bVar1 = Expression::is<wasm::Const>(pBVar5->left), bVar1 ||
        (bVar1 = Expression::is<wasm::Const>(pBVar5->right), bVar1)))) {
      bVar1 = true;
      pLVar4 = std::unique_ptr<wasm::LazyLocalGraph,_std::default_delete<wasm::LazyLocalGraph>_>::
               operator->(&this->localGraph);
      this_01 = LazyLocalGraph::getSetInfluences(pLVar4,(LocalSet *)add);
      __end7 = std::
               unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
               ::begin(this_01);
      get = (LocalGet *)
            std::
            unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
            ::end(this_01);
      while (bVar2 = std::__detail::operator!=
                               (&__end7.super__Node_iterator_base<wasm::LocalGet_*,_false>,
                                (_Node_iterator_base<wasm::LocalGet_*,_false> *)&get), bVar2) {
        ppLVar6 = std::__detail::_Node_const_iterator<wasm::LocalGet_*,_true,_false>::operator*
                            (&__end7);
        this_02 = anon_unknown_177::GetParents::getParent((GetParents *)&__range2,*ppLVar6);
        if (this_02 == (Expression *)0x0) {
          __assert_fail("parent",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OptimizeAddedConstants.cpp"
                        ,0x187,"void wasm::OptimizeAddedConstants::findPropagatable()");
        }
        bVar2 = Expression::is<wasm::Load>(this_02);
        if ((!bVar2) && (bVar2 = Expression::is<wasm::Store>(this_02), !bVar2)) {
          bVar1 = false;
          break;
        }
        std::__detail::_Node_const_iterator<wasm::LocalGet_*,_true,_false>::operator++(&__end7);
      }
      if (bVar1) {
        std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>::
        insert(&this->propagatable,(value_type *)&add);
      }
    }
    std::_Rb_tree_const_iterator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>::
    operator++(&__end2);
  } while( true );
}

Assistant:

void findPropagatable() {
    // Conservatively, only propagate if all uses can be removed of the
    // original. That is,
    //  x = a + 10
    //  f(x)
    //  g(x)
    // should be optimized to
    //  f(a, offset=10)
    //  g(a, offset=10)
    // but if x has other uses, then avoid doing so - we'll be doing that add
    // anyhow, so the load/store offset trick won't actually help.
    GetParents parents(getFunction()->body);
    for (auto& [location, _] : localGraph->getLocations()) {
      if (auto* set = location->dynCast<LocalSet>()) {
        if (auto* add = set->value->dynCast<Binary>()) {
          if (add->op == AddInt32) {
            if (add->left->is<Const>() || add->right->is<Const>()) {
              // Looks like this might be relevant, check all uses.
              bool canPropagate = true;
              for (auto* get : localGraph->getSetInfluences(set)) {
                auto* parent = parents.getParent(get);
                // if this is at the top level, it's the whole body - no set can
                // exist!
                assert(parent);
                if (!(parent->is<Load>() || parent->is<Store>())) {
                  canPropagate = false;
                  break;
                }
              }
              if (canPropagate) {
                propagatable.insert(set);
              }
            }
          }
        }
      }
    }
  }